

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTableGen.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::ParseTableGen::AllocateTables
          (ParseTableGen *this,size_t stateCount,size_t terminalCount,size_t nonTerminalCount)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong local_60;
  size_t i_1;
  uint16_t *newGotoTable;
  size_t newGotoSize;
  size_t i;
  unsigned_short *local_38;
  uint16_t *newActionTable;
  size_t newActionSize;
  size_t nonTerminalCount_local;
  size_t terminalCount_local;
  size_t stateCount_local;
  ParseTableGen *this_local;
  
  newActionSize = nonTerminalCount;
  nonTerminalCount_local = terminalCount;
  terminalCount_local = stateCount;
  stateCount_local = (size_t)this;
  ParseTable::FreeTables(&this->super_ParseTable);
  (this->super_ParseTable).ActionWidth = nonTerminalCount_local;
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::reserve
            (&(this->super_ParseTable).ActionTable,terminalCount_local);
  newActionTable = (uint16_t *)(terminalCount_local * (this->super_ParseTable).ActionWidth);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = newActionTable;
  uVar3 = SUB168(auVar1 * ZEXT816(2),0);
  if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_38 = (unsigned_short *)operator_new__(uVar3);
  i._6_2_ = 0;
  std::fill<unsigned_short*,unsigned_short>
            (local_38,local_38 + (long)newActionTable,(unsigned_short *)((long)&i + 6));
  for (newGotoSize = 0; newGotoSize < terminalCount_local; newGotoSize = newGotoSize + 1) {
    std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::push_back
              (&(this->super_ParseTable).ActionTable,&local_38);
    local_38 = local_38 + (this->super_ParseTable).ActionWidth;
  }
  (this->super_ParseTable).GotoWidth = newActionSize;
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::reserve
            (&(this->super_ParseTable).GotoTable,terminalCount_local);
  newGotoTable = (uint16_t *)(terminalCount_local * (this->super_ParseTable).GotoWidth);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = newGotoTable;
  uVar3 = SUB168(auVar2 * ZEXT816(2),0);
  if (SUB168(auVar2 * ZEXT816(2),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  i_1 = (size_t)operator_new__(uVar3);
  std::fill<unsigned_short*,unsigned_short>
            ((unsigned_short *)i_1,(unsigned_short *)(i_1 + newGotoTable * 2),&EmptyGoto);
  for (local_60 = 0; local_60 < terminalCount_local; local_60 = local_60 + 1) {
    std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::push_back
              (&(this->super_ParseTable).GotoTable,(value_type *)&i_1);
    i_1 = (this->super_ParseTable).GotoWidth * 2 + i_1;
  }
  return;
}

Assistant:

void ParseTableGen::AllocateTables(size_t stateCount, size_t terminalCount,
                                   size_t nonTerminalCount) {
    FreeTables();

    // *** Allocate memory for the action table

    ActionWidth = terminalCount;
    ActionTable.reserve(stateCount);

    const auto newActionSize  = stateCount * ActionWidth;
    auto       newActionTable = new uint16_t[newActionSize];
    std::fill(newActionTable, newActionTable + newActionSize, uint16_t(0u));

    for (size_t i = 0u; i < stateCount; ++i, newActionTable += ActionWidth)
        ActionTable.push_back(newActionTable);

    // *** Allocate memory for the goto table

    GotoWidth = nonTerminalCount;
    GotoTable.reserve(stateCount);

    const auto newGotoSize  = stateCount * GotoWidth;
    auto       newGotoTable = new uint16_t[newGotoSize];
    std::fill(newGotoTable, newGotoTable + newGotoSize, EmptyGoto);

    for (size_t i = 0u; i < stateCount; ++i, newGotoTable += GotoWidth)
        GotoTable.push_back(newGotoTable);
}